

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O1

void __thiscall
TempChatBanGameCommand::trigger
          (TempChatBanGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  undefined4 uVar1;
  undefined4 uVar2;
  PlayerInfo *pPVar3;
  char *pcVar4;
  undefined8 uVar5;
  char *pcVar6;
  long lVar7;
  basic_string_view<char,_std::char_traits<char>_> *args_2;
  char *in_R9;
  long lVar8;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> dVar9;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  split_parameters;
  rep local_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_b8;
  long local_90;
  char *pcStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined8 local_40;
  char *local_38;
  
  args_2 = (basic_string_view<char,_std::char_traits<char>_> *)0x13ab67;
  jessilib::
  word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
            (&local_b8,(jessilib *)parameters._M_str,
             (char *)((jessilib *)parameters._M_str + parameters._M_len)," \t","",in_R9);
  lVar7 = CONCAT44(local_b8.first._M_len._4_4_,(undefined4)local_b8.first._M_len);
  if (lVar7 == 0) {
    pcVar4 = "Error: Too few parameters. Syntax: tchatban [Duration] <player> [Reason]";
    uVar5 = 0x48;
    goto LAB_0013288c;
  }
  pcVar4 = (char *)CONCAT44(local_b8.first._M_str._4_4_,local_b8.first._M_str._0_4_);
  lVar8 = CONCAT44(local_b8.second._M_len._4_4_,(undefined4)local_b8.second._M_len);
  local_c0 = pluginInstance.m_defaultTempBanTime.__r;
  pcVar6 = (char *)CONCAT44(local_b8.second._M_str._4_4_,local_b8.second._M_str._0_4_);
  pPVar3 = (PlayerInfo *)RenX::Server::getPlayerByPartName(source,lVar7,pcVar4);
  if (pPVar3 == (PlayerInfo *)0x0) {
    if (CONCAT44(local_b8.second._M_len._4_4_,(undefined4)local_b8.second._M_len) != 0) {
      dVar9 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (pcVar4,pcVar4 + lVar7);
      local_c0 = (rep)dVar9.duration.__r;
      if (0 < local_c0) {
        if (pluginInstance.m_maxTempBanTime.__r < local_c0) {
          local_c0 = pluginInstance.m_maxTempBanTime.__r;
        }
        args_2 = (basic_string_view<char,_std::char_traits<char>_> *)0x13ab67;
        jessilib::
        word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
                  ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *)&local_80,
                   (jessilib *)CONCAT44(local_b8.second._M_str._4_4_,local_b8.second._M_str._0_4_),
                   (char *)((jessilib *)
                            CONCAT44(local_b8.second._M_str._4_4_,local_b8.second._M_str._0_4_) +
                           CONCAT44(local_b8.second._M_len._4_4_,(undefined4)local_b8.second._M_len)
                           )," \t","",in_R9);
        local_b8.first._M_len._0_4_ = local_80._M_dataplus._M_p._0_4_;
        local_b8.first._M_len._4_4_ = local_80._M_dataplus._M_p._4_4_;
        local_b8.first._M_str._0_4_ = (undefined4)local_80._M_string_length;
        local_b8.first._M_str._4_4_ = local_80._M_string_length._4_4_;
        local_b8.second._M_len._0_4_ = local_80.field_2._M_allocated_capacity._0_4_;
        local_b8.second._M_len._4_4_ = local_80.field_2._M_allocated_capacity._4_4_;
        local_b8.second._M_str._0_4_ = local_80.field_2._8_4_;
        local_b8.second._M_str._4_4_ = local_80.field_2._12_4_;
        lVar8 = CONCAT44(local_80.field_2._M_allocated_capacity._4_4_,
                         local_80.field_2._M_allocated_capacity._0_4_);
        pcVar6 = (char *)CONCAT44(local_80.field_2._12_4_,local_80.field_2._8_4_);
        pPVar3 = (PlayerInfo *)
                 RenX::Server::getPlayerByPartName
                           (source,CONCAT44(local_80._M_dataplus._M_p._4_4_,
                                            local_80._M_dataplus._M_p._0_4_),
                            CONCAT44(local_80._M_string_length._4_4_,
                                     (undefined4)local_80._M_string_length));
        goto LAB_001327dc;
      }
    }
    pPVar3 = (PlayerInfo *)0x0;
  }
LAB_001327dc:
  pcVar4 = "No reason";
  if (lVar8 != 0) {
    pcVar4 = pcVar6;
  }
  lVar7 = 9;
  if (lVar8 != 0) {
    lVar7 = lVar8;
  }
  if (pPVar3 == (PlayerInfo *)0x0) {
    pcVar4 = "Error: Player not found.";
    uVar5 = 0x18;
  }
  else if (pPVar3 == player) {
    pcVar4 = "Error: You can not ban yourself.";
    uVar5 = 0x20;
  }
  else {
    if (player->access <= pPVar3->access) {
      local_40 = 0x24;
      local_38 = "Error: You can not ban higher level ";
      local_50._M_len = pluginInstance.m_staffTitle._M_string_length;
      local_50._M_str = pluginInstance.m_staffTitle._M_dataplus._M_p;
      local_60._M_len = 2;
      local_60._M_str = "s.";
      jessilib::
      join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                (&local_80,(jessilib *)&local_40,&local_50,&local_60,args_2);
      RenX::Server::sendMessage
                (source,player,
                 CONCAT44(local_80._M_string_length._4_4_,(undefined4)local_80._M_string_length),
                 CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_) ==
          &local_80.field_2) {
        return;
      }
      operator_delete((undefined1 *)
                      CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_),
                      CONCAT44(local_80.field_2._M_allocated_capacity._4_4_,
                               local_80.field_2._M_allocated_capacity._0_4_) + 1);
      return;
    }
    RenX::Server::mute((PlayerInfo *)source);
    local_90._0_4_ = (undefined4)lVar7;
    pcStack_88._0_4_ = SUB84(pcVar4,0);
    uVar1 = (undefined4)local_90;
    local_90 = lVar7;
    uVar2 = pcStack_88._0_4_;
    pcStack_88 = pcVar4;
    RenX::BanDatabase::add
              (RenX::banDatabase,source,pPVar3,(player->name)._M_string_length,
               (player->name)._M_dataplus._M_p,local_c0,uVar1,uVar2,0x40);
    pcVar4 = "Player has been temporarily muted and chat banned from the game.";
    uVar5 = 0x40;
  }
LAB_0013288c:
  RenX::Server::sendMessage(source,player,uVar5,pcVar4);
  return;
}

Assistant:

void TempChatBanGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	auto split_parameters = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (!split_parameters.first.empty()) {
		std::string_view name = split_parameters.first;
		std::chrono::seconds duration = pluginInstance.getDefaultTBanTime();
		std::string_view reason = split_parameters.second;

		RenX::PlayerInfo *target = source->getPlayerByPartName(name);
		if (target == nullptr
			&& !split_parameters.second.empty()) {
			// Try reading first token as duration
			duration = jessilib::duration_from_string(name.data(), name.data() + name.size()).duration;
			if (duration.count() > 0) {
				duration = std::min(duration, pluginInstance.getMaxTBanTime());
				split_parameters = jessilib::word_split_once_view(split_parameters.second, WHITESPACE_SV);
				name = split_parameters.first;
				reason = split_parameters.second;
				target = source->getPlayerByPartName(name);
			}
		}

		if (reason.empty()) {
			reason = "No reason"sv;
		}

		if (target == nullptr)
			source->sendMessage(*player, "Error: Player not found."sv);
		else if (player == target)
			source->sendMessage(*player, "Error: You can not ban yourself."sv);
		else if (target->access >= player->access)
			source->sendMessage(*player, jessilib::join<std::string>("Error: You can not ban higher level "sv, pluginInstance.getStaffTitle(), "s."sv));
		else {
			source->mute(*target);
			RenX::banDatabase->add(source, *target, player->name, reason, duration, RenX::BanDatabase::Entry::FLAG_TYPE_CHAT);
			source->sendMessage(*player, "Player has been temporarily muted and chat banned from the game."sv);
		}
	}
	else
		source->sendMessage(*player, "Error: Too few parameters. Syntax: tchatban [Duration] <player> [Reason]"sv);
}